

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_sha256_init_encode(secp256k1_sha256 *hash)

{
  secp256k1_sha256_initialize(hash);
  hash->s[0] = 0xd1a6524b;
  hash->s[1] = 0x28594b3;
  hash->s[2] = 0x96e42f4e;
  hash->s[3] = 0x1037a177;
  hash->s[4] = 0x1b8fcb8b;
  hash->s[5] = 0x56023885;
  hash->s[6] = 0x2560ede1;
  hash->s[7] = 0xd626b715;
  hash->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_ellswift_sha256_init_encode(secp256k1_sha256* hash) {
    secp256k1_sha256_initialize(hash);
    hash->s[0] = 0xd1a6524bul;
    hash->s[1] = 0x028594b3ul;
    hash->s[2] = 0x96e42f4eul;
    hash->s[3] = 0x1037a177ul;
    hash->s[4] = 0x1b8fcb8bul;
    hash->s[5] = 0x56023885ul;
    hash->s[6] = 0x2560ede1ul;
    hash->s[7] = 0xd626b715ul;

    hash->bytes = 64;
}